

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_cipher_do_ctracpkm_omac(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  int iVar2;
  char *file;
  long in_RCX;
  long in_RDX;
  _func_int_EVP_CIPHER_CTX_ptr_uchar_ptr_uchar_ptr_size_t *in_RSI;
  uchar *in_RDI;
  gost_grasshopper_cipher_ctx_ctr *c;
  EVP_CIPHER_CTX *in_stack_00000008;
  int result;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  file = (char *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
  if (iVar1 != 0) {
    EVP_DigestSignUpdate(*(undefined8 *)(file + 0x1c8),in_RDX,in_RCX);
  }
  if ((in_RDX == 0) && (in_RCX == 0)) {
    iVar1 = gost2015_final_call(in_stack_00000008,(EVP_MD_CTX *)c,
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                                ,in_RSI);
  }
  else if (in_RDX == 0) {
    ERR_GOST_error(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,file,0);
    iVar1 = -1;
  }
  else {
    iVar1 = gost_grasshopper_cipher_do_ctracpkm
                      ((EVP_CIPHER_CTX *)out,in,(uchar *)inl,(size_t)in_stack_00000008);
    iVar2 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    if (iVar2 == 0) {
      EVP_DigestSignUpdate(*(undefined8 *)(file + 0x1c8),in_RSI,in_RCX);
    }
  }
  return iVar1;
}

Assistant:

static int gost_grasshopper_cipher_do_ctracpkm_omac(EVP_CIPHER_CTX *ctx,
                                                    unsigned char *out,
                                                    const unsigned char *in,
                                                    size_t inl)
{
    int result;
    gost_grasshopper_cipher_ctx_ctr *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    /* As in and out can be the same pointer, process unencrypted here */
    if (EVP_CIPHER_CTX_encrypting(ctx))
        EVP_DigestSignUpdate(c->omac_ctx, in, inl);

    if (in == NULL && inl == 0) { /* Final call */
        return gost2015_final_call(ctx, c->omac_ctx, KUZNYECHIK_MAC_MAX_SIZE, c->tag, gost_grasshopper_cipher_do_ctracpkm);
    }

    if (in == NULL) {
        GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_DO_CTRACPKM_OMAC, ERR_R_EVP_LIB);
        return -1;
    }
    result = gost_grasshopper_cipher_do_ctracpkm(ctx, out, in, inl);

    /* As in and out can be the same pointer, process decrypted here */
    if (!EVP_CIPHER_CTX_encrypting(ctx))
        EVP_DigestSignUpdate(c->omac_ctx, out, inl);

    return result;
}